

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O0

int LZWEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  byte bVar1;
  ushort uVar2;
  LZWCodecState *sp_00;
  uint8_t *puVar3;
  uint8_t *puVar4;
  hcode_t hVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  long local_b8;
  long local_b0;
  tmsize_t rat;
  uint8_t *limit;
  uint8_t *op;
  uint local_90;
  int nbits;
  int maxcode;
  int free_ent;
  long nextbits;
  WordType nextdata;
  tmsize_t checkpoint;
  tmsize_t outcount;
  tmsize_t incount;
  long disp;
  uint uStack_4c;
  hcode_t ent;
  int c;
  int h;
  hash_t *hp;
  long fcode;
  LZWCodecState *sp;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  sp_00 = (LZWCodecState *)tif->tif_data;
  if (sp_00 == (LZWCodecState *)0x0) {
    tif_local._4_4_ = 0;
  }
  else {
    if (sp_00->enc_hashtab == (hash_t *)0x0) {
      __assert_fail("sp->enc_hashtab != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                    ,0x46e,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    lVar8 = sp_00->enc_incount;
    checkpoint = sp_00->enc_outcount;
    nextdata = sp_00->enc_checkpoint;
    nextbits = (sp_00->base).nextdata;
    _maxcode = (sp_00->base).nextbits;
    nbits = (int)(sp_00->base).free_ent;
    local_90 = (uint)(sp_00->base).maxcode;
    uVar2 = (sp_00->base).nbits;
    op._4_4_ = (uint)uVar2;
    limit = tif->tif_rawcp;
    puVar3 = sp_00->enc_rawlimit;
    disp._6_2_ = (hcode_t)sp_00->enc_oldcode;
    tStack_28 = cc;
    cc_local = (tmsize_t)bp;
    if ((disp._6_2_ == 0xffff) && (cc_local = (tmsize_t)bp, 0 < cc)) {
      nextbits = nextbits << ((byte)uVar2 & 0x3f) | 0x100;
      lVar7 = (int)op._4_4_ + _maxcode;
      *limit = (uint8_t)((ulong)nextbits >> ((char)lVar7 - 8U & 0x3f));
      _maxcode = lVar7 + -8;
      puVar4 = limit + 1;
      if (7 < _maxcode) {
        limit[1] = (uint8_t)((ulong)nextbits >> ((char)_maxcode - 8U & 0x3f));
        _maxcode = lVar7 + -0x10;
        puVar4 = limit + 2;
      }
      limit = puVar4;
      checkpoint = (int)op._4_4_ + checkpoint;
      disp._6_2_ = (hcode_t)*bp;
      tStack_28 = cc + -1;
      lVar8 = lVar8 + 1;
      cc_local = (tmsize_t)(bp + 1);
    }
LAB_003e9029:
    outcount = lVar8;
    hVar5 = (hcode_t)nbits;
    if (0 < tStack_28) {
      lVar10 = cc_local + 1;
      bVar1 = *(byte *)cc_local;
      tStack_28 = tStack_28 + -1;
      lVar8 = outcount + 1;
      lVar7 = (long)(int)(uint)bVar1 * 0x1000 + (ulong)disp._6_2_;
      uStack_4c = (uint)bVar1 << 5 ^ (uint)disp._6_2_;
      _c = sp_00->enc_hashtab + (int)uStack_4c;
      cc_local = lVar10;
      if (_c->hash == lVar7) {
        disp._6_2_ = _c->code;
      }
      else {
        if (-1 < _c->hash) {
          incount._0_4_ = 0x2329 - uStack_4c;
          if (uStack_4c == 0) {
            incount._0_4_ = 1;
          }
          do {
            uStack_4c = uStack_4c - (int)incount;
            if ((int)uStack_4c < 0) {
              uStack_4c = uStack_4c + 0x2329;
            }
            _c = sp_00->enc_hashtab + (int)uStack_4c;
            if (_c->hash == lVar7) {
              disp._6_2_ = _c->code;
              goto LAB_003e9029;
            }
          } while (-1 < _c->hash);
        }
        if (puVar3 < limit) {
          tif->tif_rawcc = (long)limit - (long)tif->tif_rawdata;
          iVar6 = TIFFFlushData1(tif);
          if (iVar6 == 0) {
            return 0;
          }
          limit = tif->tif_rawdata;
        }
        bVar9 = (byte)op._4_4_;
        nextbits = nextbits << (bVar9 & 0x3f) | (ulong)disp._6_2_;
        lVar10 = (int)op._4_4_ + _maxcode;
        *limit = (uint8_t)((ulong)nextbits >> ((char)lVar10 - 8U & 0x3f));
        _maxcode = lVar10 + -8;
        puVar4 = limit + 1;
        if (7 < _maxcode) {
          limit[1] = (uint8_t)((ulong)nextbits >> ((char)_maxcode - 8U & 0x3f));
          _maxcode = lVar10 + -0x10;
          puVar4 = limit + 2;
        }
        limit = puVar4;
        checkpoint = (int)op._4_4_ + checkpoint;
        disp._6_2_ = (hcode_t)bVar1;
        nbits = nbits + 1;
        _c->code = hVar5;
        _c->hash = lVar7;
        if (nbits == 0xffe) {
          cl_hash(sp_00);
          sp_00->enc_ratio = 0;
          outcount = 0;
          nbits = 0x102;
          nextbits = nextbits << (bVar9 & 0x3f) | 0x100;
          lVar8 = (int)op._4_4_ + _maxcode;
          *limit = (uint8_t)((ulong)nextbits >> ((char)lVar8 - 8U & 0x3f));
          _maxcode = lVar8 + -8;
          puVar4 = limit + 1;
          if (7 < _maxcode) {
            limit[1] = (uint8_t)((ulong)nextbits >> ((char)_maxcode - 8U & 0x3f));
            _maxcode = lVar8 + -0x10;
            puVar4 = limit + 2;
          }
          limit = puVar4;
          checkpoint = (tmsize_t)(int)op._4_4_;
          op._4_4_ = 9;
          local_90 = 0x1ff;
          lVar8 = outcount;
        }
        else if ((int)local_90 < nbits) {
          op._4_4_ = op._4_4_ + 1;
          if (0xc < (int)op._4_4_) {
            __assert_fail("nbits <= BITS_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                          ,0x4e0,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
          }
          local_90 = (int)(1L << ((byte)op._4_4_ & 0x3f)) - 1;
        }
        else if ((long)nextdata <= lVar8) {
          nextdata = outcount + 0x2711;
          if (lVar8 < 0x800000) {
            local_b0 = (lVar8 * 0x100) / checkpoint;
          }
          else {
            if (checkpoint >> 8 == 0) {
              local_b8 = 0x7fffffff;
            }
            else {
              local_b8 = lVar8 / (checkpoint >> 8);
            }
            local_b0 = local_b8;
          }
          if (sp_00->enc_ratio < local_b0) {
            sp_00->enc_ratio = local_b0;
          }
          else {
            cl_hash(sp_00);
            sp_00->enc_ratio = 0;
            outcount = 0;
            nbits = 0x102;
            nextbits = nextbits << (bVar9 & 0x3f) | 0x100;
            lVar8 = (int)op._4_4_ + _maxcode;
            *limit = (uint8_t)((ulong)nextbits >> ((char)lVar8 - 8U & 0x3f));
            _maxcode = lVar8 + -8;
            puVar4 = limit + 1;
            if (7 < _maxcode) {
              limit[1] = (uint8_t)((ulong)nextbits >> ((char)_maxcode - 8U & 0x3f));
              _maxcode = lVar8 + -0x10;
              puVar4 = limit + 2;
            }
            limit = puVar4;
            checkpoint = (tmsize_t)(int)op._4_4_;
            op._4_4_ = 9;
            local_90 = 0x1ff;
            lVar8 = outcount;
          }
        }
      }
      goto LAB_003e9029;
    }
    sp_00->enc_incount = outcount;
    sp_00->enc_outcount = checkpoint;
    sp_00->enc_checkpoint = nextdata;
    sp_00->enc_oldcode = (uint)disp._6_2_;
    (sp_00->base).nextdata = nextbits;
    (sp_00->base).nextbits = _maxcode;
    (sp_00->base).free_ent = hVar5;
    (sp_00->base).maxcode = (unsigned_short)local_90;
    (sp_00->base).nbits = (unsigned_short)op._4_4_;
    tif->tif_rawcp = limit;
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

static int LZWEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    register LZWCodecState *sp = EncoderState(tif);
    register long fcode;
    register hash_t *hp;
    register int h, c;
    hcode_t ent;
    long disp;
    tmsize_t incount, outcount, checkpoint;
    WordType nextdata;
    long nextbits;
    int free_ent, maxcode, nbits;
    uint8_t *op;
    uint8_t *limit;

    (void)s;
    if (sp == NULL)
        return (0);

    assert(sp->enc_hashtab != NULL);

    /*
     * Load local state.
     */
    incount = sp->enc_incount;
    outcount = sp->enc_outcount;
    checkpoint = sp->enc_checkpoint;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    free_ent = sp->lzw_free_ent;
    maxcode = sp->lzw_maxcode;
    nbits = sp->lzw_nbits;
    op = tif->tif_rawcp;
    limit = sp->enc_rawlimit;
    ent = (hcode_t)sp->enc_oldcode;

    if (ent == (hcode_t)-1 && cc > 0)
    {
        /*
         * NB: This is safe because it can only happen
         *     at the start of a strip where we know there
         *     is space in the data buffer.
         */
        PutNextCode(op, CODE_CLEAR);
        ent = *bp++;
        cc--;
        incount++;
    }
    while (cc > 0)
    {
        c = *bp++;
        cc--;
        incount++;
        fcode = ((long)c << BITS_MAX) + ent;
        h = (c << HSHIFT) ^ ent; /* xor hashing */
#ifdef _WINDOWS
        /*
         * Check hash index for an overflow.
         */
        if (h >= HSIZE)
            h -= HSIZE;
#endif
        hp = &sp->enc_hashtab[h];
        if (hp->hash == fcode)
        {
            ent = hp->code;
            continue;
        }
        if (hp->hash >= 0)
        {
            /*
             * Primary hash failed, check secondary hash.
             */
            disp = HSIZE - h;
            if (h == 0)
                disp = 1;
            do
            {
                /*
                 * Avoid pointer arithmetic because of
                 * wraparound problems with segments.
                 */
                if ((h -= disp) < 0)
                    h += HSIZE;
                hp = &sp->enc_hashtab[h];
                if (hp->hash == fcode)
                {
                    ent = hp->code;
                    goto hit;
                }
            } while (hp->hash >= 0);
        }
        /*
         * New entry, emit code and add to table.
         */
        /*
         * Verify there is space in the buffer for the code
         * and any potential Clear code that might be emitted
         * below.  The value of limit is setup so that there
         * are at least 4 bytes free--room for 2 codes.
         */
        if (op > limit)
        {
            tif->tif_rawcc = (tmsize_t)(op - tif->tif_rawdata);
            if (!TIFFFlushData1(tif))
                return 0;
            op = tif->tif_rawdata;
        }
        PutNextCode(op, ent);
        ent = (hcode_t)c;
        hp->code = (hcode_t)(free_ent++);
        hp->hash = fcode;
        if (free_ent == CODE_MAX - 1)
        {
            /* table is full, emit clear code and reset */
            cl_hash(sp);
            sp->enc_ratio = 0;
            incount = 0;
            outcount = 0;
            free_ent = CODE_FIRST;
            PutNextCode(op, CODE_CLEAR);
            nbits = BITS_MIN;
            maxcode = MAXCODE(BITS_MIN);
        }
        else
        {
            /*
             * If the next entry is going to be too big for
             * the code size, then increase it, if possible.
             */
            if (free_ent > maxcode)
            {
                nbits++;
                assert(nbits <= BITS_MAX);
                maxcode = (int)MAXCODE(nbits);
            }
            else if (incount >= checkpoint)
            {
                tmsize_t rat;
                /*
                 * Check compression ratio and, if things seem
                 * to be slipping, clear the hash table and
                 * reset state.  The compression ratio is a
                 * 24+8-bit fractional number.
                 */
                checkpoint = incount + CHECK_GAP;
                CALCRATIO(sp, rat);
                if (rat <= sp->enc_ratio)
                {
                    cl_hash(sp);
                    sp->enc_ratio = 0;
                    incount = 0;
                    outcount = 0;
                    free_ent = CODE_FIRST;
                    PutNextCode(op, CODE_CLEAR);
                    nbits = BITS_MIN;
                    maxcode = MAXCODE(BITS_MIN);
                }
                else
                    sp->enc_ratio = rat;
            }
        }
    hit:;
    }

    /*
     * Restore global state.
     */
    sp->enc_incount = incount;
    sp->enc_outcount = outcount;
    sp->enc_checkpoint = checkpoint;
    sp->enc_oldcode = ent;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->lzw_free_ent = (unsigned short)free_ent;
    sp->lzw_maxcode = (unsigned short)maxcode;
    sp->lzw_nbits = (unsigned short)nbits;
    tif->tif_rawcp = op;
    return (1);
}